

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

NamedPoint * __thiscall
helics::Input::getValue_impl<helics::NamedPoint>(void *param_1,Input *param_2)

{
  NamedPoint *val;
  
  NamedPoint::NamedPoint((NamedPoint *)param_2);
  getValue_impl<helics::NamedPoint>(param_2,param_1);
  return (NamedPoint *)param_1;
}

Assistant:

X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }